

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O2

void __thiscall PrintCCapability::PrintCCapability(PrintCCapability *this)

{
  PrintLanguageCapability::PrintLanguageCapability(&this->super_PrintLanguageCapability);
  (this->super_PrintLanguageCapability).super_CapabilityPoint._vptr_CapabilityPoint =
       (_func_int **)&PTR__PrintLanguageCapability_003fd668;
  std::__cxx11::string::assign((char *)&(this->super_PrintLanguageCapability).name);
  (this->super_PrintLanguageCapability).isdefault = true;
  return;
}

Assistant:

PrintCCapability::PrintCCapability(void)

{
  name = "c-language";
  isdefault = true;
}